

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::ParseEnumFromString(Parser *this,Type *type,string *result)

{
  bool bVar1;
  long lVar2;
  EnumDef *this_00;
  uint64_t uVar3;
  string *in_RCX;
  size_type local_1d0;
  BaseType local_1a4;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enum_val_str;
  EnumDef *enum_def;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enum_def_str;
  string local_d8 [32];
  long local_b8;
  size_type dot;
  EnumVal *ev;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> word;
  bool last;
  size_type delim;
  size_t pos;
  uint64_t u64;
  allocator<char> local_51;
  string local_50 [36];
  BaseType local_2c;
  string *psStack_28;
  BaseType base_type;
  string *result_local;
  Type *type_local;
  Parser *this_local;
  
  if ((result->field_2)._M_allocated_capacity == 0) {
    local_1a4 = *(BaseType *)result;
  }
  else {
    local_1a4 = *(BaseType *)((result->field_2)._M_allocated_capacity + 0xd0);
  }
  local_2c = local_1a4;
  psStack_28 = in_RCX;
  result_local = result;
  type_local = type;
  this_local = this;
  bVar1 = IsInteger(local_1a4);
  if (bVar1) {
    pos = 0;
    delim = 0;
    do {
      if (delim == 0xffffffffffffffff) {
        bVar1 = IsUnsigned(local_2c);
        if (bVar1) {
          NumToString<unsigned_long>(&local_188,pos);
        }
        else {
          NumToString<long>(&local_188,pos);
        }
        std::__cxx11::string::operator=(psStack_28,(string *)&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        anon_unknown_0::NoError();
        break;
      }
      lVar2 = std::__cxx11::string::find_first_of((char)type + '(',0x20);
      word.field_2._M_local_buf[0xf] = lVar2 == -1;
      std::__cxx11::string::substr((ulong)&ev,(ulong)&type[1].struct_def);
      if ((word.field_2._M_local_buf[0xf] & 1U) == 0) {
        local_1d0 = lVar2 + 1;
      }
      else {
        local_1d0 = 0xffffffffffffffff;
      }
      delim = local_1d0;
      dot = 0;
      if ((result_local->field_2)._M_allocated_capacity == 0) {
        local_b8 = std::__cxx11::string::find_first_of((char)&ev,0x2e);
        if (local_b8 == -1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_d8,"enum values need to be qualified by an enum type",
                     (allocator<char> *)(enum_def_str.field_2._M_local_buf + 0xf));
          Error(this,(string *)type);
          std::__cxx11::string::~string(local_d8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(enum_def_str.field_2._M_local_buf + 0xf));
          enum_def_str.field_2._8_4_ = 1;
        }
        else {
          std::__cxx11::string::substr((ulong)&enum_def,(ulong)&ev);
          this_00 = LookupEnum((Parser *)type,(string *)&enum_def);
          if (this_00 != (EnumDef *)0x0) {
            std::__cxx11::string::substr((ulong)local_148,(ulong)&ev);
            dot = (size_type)EnumDef::Lookup(this_00,(string *)local_148);
            std::__cxx11::string::~string((string *)local_148);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&enum_val_str.field_2 + 8),"unknown enum: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &enum_def);
            Error(this,(string *)type);
            std::__cxx11::string::~string((string *)(enum_val_str.field_2._M_local_buf + 8));
          }
          enum_def_str.field_2._9_3_ = 0;
          enum_def_str.field_2._M_local_buf[8] = this_00 == (EnumDef *)0x0;
          std::__cxx11::string::~string((string *)&enum_def);
          if (enum_def_str.field_2._8_4_ == 0) goto LAB_00122be3;
        }
      }
      else {
        dot = (size_type)
              EnumDef::Lookup((EnumDef *)(result_local->field_2)._M_allocated_capacity,(string *)&ev
                             );
LAB_00122be3:
        if (dot == 0) {
          std::operator+(&local_168,"unknown enum value: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ev);
          Error(this,(string *)type);
          std::__cxx11::string::~string((string *)&local_168);
          enum_def_str.field_2._8_4_ = 1;
        }
        else {
          uVar3 = EnumVal::GetAsUInt64((EnumVal *)dot);
          pos = uVar3 | pos;
          enum_def_str.field_2._8_4_ = 0;
        }
      }
      std::__cxx11::string::~string((string *)&ev);
    } while (enum_def_str.field_2._8_4_ == 0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_50,"not a valid value for this field",&local_51);
    Error(this,(string *)type);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseEnumFromString(const Type &type,
                                         std::string *result) {
  const auto base_type =
      type.enum_def ? type.enum_def->underlying_type.base_type : type.base_type;
  if (!IsInteger(base_type)) return Error("not a valid value for this field");
  uint64_t u64 = 0;
  for (size_t pos = 0; pos != std::string::npos;) {
    const auto delim = attribute_.find_first_of(' ', pos);
    const auto last = (std::string::npos == delim);
    auto word = attribute_.substr(pos, !last ? delim - pos : std::string::npos);
    pos = !last ? delim + 1 : std::string::npos;
    const EnumVal *ev = nullptr;
    if (type.enum_def) {
      ev = type.enum_def->Lookup(word);
    } else {
      auto dot = word.find_first_of('.');
      if (std::string::npos == dot)
        return Error("enum values need to be qualified by an enum type");
      auto enum_def_str = word.substr(0, dot);
      const auto enum_def = LookupEnum(enum_def_str);
      if (!enum_def) return Error("unknown enum: " + enum_def_str);
      auto enum_val_str = word.substr(dot + 1);
      ev = enum_def->Lookup(enum_val_str);
    }
    if (!ev) return Error("unknown enum value: " + word);
    u64 |= ev->GetAsUInt64();
  }
  *result = IsUnsigned(base_type) ? NumToString(u64)
                                  : NumToString(static_cast<int64_t>(u64));
  return NoError();
}